

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::AnnotatedHandler::gatherForEncode
          (AnnotatedHandler *this,JsonCodec *codec,Reader *input,StringPtr prefix,
          StringPtr morePrefix,
          Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField> *flattenedFields)

{
  ushort uVar1;
  AnnotatedHandler *pAVar2;
  FlattenedField *pFVar3;
  FlattenedField *pFVar4;
  ArrayPtr<const_char> AVar5;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Field field_04;
  StringPtr prefix_00;
  StringPtr prefix_01;
  StringPtr prefix_02;
  StringPtr prefix_03;
  StringPtr prefix_04;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  FieldInfo *pFVar9;
  size_t sVar10;
  RawBrandedSchema *pRVar11;
  ulong uVar12;
  ulong uVar13;
  Type TVar14;
  String ownPrefix;
  Field field;
  NullableValue<capnp::StructSchema::Field> _which1269;
  StructSchema schema;
  ReaderFor<capnp::DynamicStruct> reader;
  RawBrandedSchema *local_440;
  size_t local_438;
  RawBrandedSchema *local_428;
  Schema SStack_420;
  ArrayDisposer *local_418;
  undefined1 local_408 [48];
  anon_union_64_1_a8a2e026_for_OneOf<capnp::StructSchema::Field,_capnp::Type>_2 aStack_3d8;
  Reader local_398;
  ArrayPtr<const_char> local_348;
  StructReader local_338;
  ulong local_300;
  OneOf<capnp::StructSchema::Field,_capnp::Type> local_2f8;
  undefined1 local_2b0 [16];
  ArrayDisposer *pAStack_2a0;
  SegmentReader *local_298;
  CapTableReader *pCStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  uint16_t *local_278;
  ulong uStack_270;
  OneOf<capnp::StructSchema::Field,_capnp::Type> local_268;
  OneOf<capnp::StructSchema::Field,_capnp::Type> local_220;
  Schema local_1d8;
  ReaderFor<DynamicStruct> local_1d0;
  Reader local_198;
  Reader local_150;
  Reader local_108;
  Reader local_c0;
  Reader local_78;
  
  local_440 = (RawBrandedSchema *)prefix.content.ptr;
  local_428 = (RawBrandedSchema *)0x0;
  SStack_420.raw = (RawBrandedSchema *)0x0;
  local_418 = (ArrayDisposer *)0x0;
  local_438 = morePrefix.content.size_;
  sVar10 = prefix.content.size_;
  if (morePrefix.content.size_ - 1 != 0) {
    pRVar11 = (RawBrandedSchema *)(prefix.content.size_ - 1);
    if (pRVar11 == (RawBrandedSchema *)0x0) {
      local_440 = (RawBrandedSchema *)morePrefix.content.ptr;
      sVar10 = local_438;
    }
    else {
      local_348.ptr = morePrefix.content.ptr;
      local_348.size_ = morePrefix.content.size_ - 1;
      local_2b0._0_8_ = local_440;
      local_2b0._8_8_ = pRVar11;
      kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                ((String *)local_408,(_ *)local_2b0,&local_348,
                 (ArrayPtr<const_char> *)morePrefix.content.ptr);
      local_428 = (RawBrandedSchema *)local_408._0_8_;
      SStack_420.raw = (RawBrandedSchema *)local_408._8_8_;
      local_440 = (RawBrandedSchema *)0x54bab9;
      if ((Schema)local_408._8_8_ != (Schema)0x0) {
        local_440 = (RawBrandedSchema *)local_408._0_8_;
      }
      local_418 = (ArrayDisposer *)local_408._16_8_;
      sVar10 = local_408._8_8_ + (ulong)((Schema)local_408._8_8_ == (Schema)0x0);
    }
  }
  local_438 = sVar10;
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_1d0,input);
  local_1d8 = local_1d0.schema.super_Schema.raw;
  StructSchema::getNonUnionFields((FieldSubset *)local_2b0,(StructSchema *)&local_1d8);
  uVar13 = uStack_270 & 0xffffffff;
  if (uVar13 != 0) {
    uVar12 = 0;
    local_300 = uVar13;
    do {
      uVar6 = local_2b0._0_8_;
      uVar1 = local_278[uVar12];
      capnp::_::ListReader::getStructElement(&local_338,(ListReader *)(local_2b0 + 8),(uint)uVar1);
      local_348.ptr = (char *)uVar6;
      local_348.size_ = CONCAT44(local_348.size_._4_4_,(uint)uVar1);
      pFVar9 = (this->fields).ptr + (uint)uVar1;
      field_00._8_8_ = local_348.size_;
      field_00.parent.super_Schema.raw = (Schema)(Schema)uVar6;
      field_00.proto._reader.segment = local_338.segment;
      field_00.proto._reader.capTable = local_338.capTable;
      field_00.proto._reader.data = local_338.data;
      field_00.proto._reader.pointers = local_338.pointers;
      field_00.proto._reader.dataSize = local_338.dataSize;
      field_00.proto._reader.pointerCount = local_338.pointerCount;
      field_00.proto._reader._38_2_ = local_338._38_2_;
      field_00.proto._reader.nestingLimit = local_338.nestingLimit;
      field_00.proto._reader._44_4_ = local_338._44_4_;
      bVar8 = DynamicStruct::Reader::has(&local_1d0,field_00,((codec->impl).ptr)->hasMode);
      if (bVar8) {
        pAVar2 = (pFVar9->flattenHandler).ptr;
        if (pAVar2 == (AnnotatedHandler *)0x0) {
          AVar5 = (pFVar9->name).content;
          local_268.tag = 1;
          local_268.field_1._48_4_ = local_338.dataSize;
          local_268.field_1._52_2_ = local_338.pointerCount;
          local_268.field_1._54_2_ = local_338._38_2_;
          local_268.field_1._56_8_ = local_338._40_8_;
          local_268.field_1._32_8_ = local_338.data;
          local_268.field_1._40_8_ = local_338.pointers;
          local_268.field_1._16_8_ = local_338.segment;
          local_268.field_1._24_8_ = local_338.capTable;
          local_268.field_1._0_8_ = local_348.ptr;
          local_268.field_1._8_8_ = local_348.size_;
          field_02._8_8_ = local_348.size_;
          field_02.parent.super_Schema.raw = (Schema)(Schema)local_348.ptr;
          field_02.proto._reader.segment = local_338.segment;
          field_02.proto._reader.capTable = local_338.capTable;
          field_02.proto._reader.data = local_338.data;
          field_02.proto._reader.pointers = local_338.pointers;
          field_02.proto._reader.dataSize = local_338.dataSize;
          field_02.proto._reader.pointerCount = local_338.pointerCount;
          field_02.proto._reader._38_2_ = local_338._38_2_;
          field_02.proto._reader.nestingLimit = local_338.nestingLimit;
          field_02.proto._reader._44_4_ = local_338._44_4_;
          DynamicStruct::Reader::get(&local_c0,&local_1d0,field_02);
          prefix_01.content.size_ = local_438;
          prefix_01.content.ptr = (char *)local_440;
          FlattenedField::FlattenedField
                    ((FlattenedField *)local_408,prefix_01,(StringPtr)AVar5,&local_268,&local_c0);
          pFVar3 = (flattenedFields->builder).endPtr;
          if ((flattenedFields->builder).pos == pFVar3) {
            pFVar4 = (flattenedFields->builder).ptr;
            sVar10 = ((long)pFVar3 - (long)pFVar4 >> 3) * -0x590b21642c8590b2;
            if (pFVar3 == pFVar4) {
              sVar10 = 4;
            }
            kj::Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::setCapacity
                      (flattenedFields,sVar10);
          }
          kj::ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::
          add<capnp::JsonCodec::AnnotatedHandler::FlattenedField>
                    (&flattenedFields->builder,(FlattenedField *)local_408);
          DynamicValue::Reader::~Reader(&local_398);
          uVar7 = local_408._8_8_;
          uVar6 = local_408._0_8_;
          if (local_408._40_4_ == 1) {
            local_408._40_4_ = 0;
          }
          if (local_408._40_4_ == 2) {
            local_408._40_4_ = 0;
          }
          if ((RawBrandedSchema *)local_408._0_8_ != (RawBrandedSchema *)0x0) {
            local_408._0_8_ = (RawBrandedSchema *)0x0;
            local_408._8_8_ = (Schema)0x0;
            (***(_func_int ***)local_408._16_8_)(local_408._16_8_,uVar6,1,uVar7,uVar7,0);
          }
          DynamicValue::Reader::~Reader(&local_c0);
          if (local_268.tag == 1) {
            local_268.tag = 0;
          }
          uVar13 = local_300;
          if (local_268.tag == 2) {
            local_268.tag = 0;
          }
        }
        else {
          field_01._8_8_ = local_348.size_;
          field_01.parent.super_Schema.raw = (Schema)(Schema)local_348.ptr;
          field_01.proto._reader.segment = local_338.segment;
          field_01.proto._reader.capTable = local_338.capTable;
          field_01.proto._reader.data = local_338.data;
          field_01.proto._reader.pointers = local_338.pointers;
          field_01.proto._reader.dataSize = local_338.dataSize;
          field_01.proto._reader.pointerCount = local_338.pointerCount;
          field_01.proto._reader._38_2_ = local_338._38_2_;
          field_01.proto._reader.nestingLimit = local_338.nestingLimit;
          field_01.proto._reader._44_4_ = local_338._44_4_;
          DynamicStruct::Reader::get(&local_78,&local_1d0,field_01);
          prefix_00.content.size_ = local_438;
          prefix_00.content.ptr = (char *)local_440;
          gatherForEncode(pAVar2,codec,&local_78,prefix_00,(StringPtr)(pFVar9->prefix).content,
                          flattenedFields);
          DynamicValue::Reader::~Reader(&local_78);
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
  }
  DynamicStruct::Reader::which((Maybe<capnp::StructSchema::Field> *)local_408,&local_1d0);
  local_2b0[0] = local_408[0];
  if (local_408[0] == true) {
    local_288._4_4_ = local_408._44_4_;
    local_288._0_4_ = local_408._40_4_;
    local_278 = (uint16_t *)aStack_3d8._8_8_;
    uStack_270 = aStack_3d8._16_8_;
    uStack_280 = aStack_3d8._0_8_;
    local_298 = (SegmentReader *)local_408._24_8_;
    pCStack_290 = (CapTableReader *)local_408._32_8_;
    local_2b0._8_8_ = local_408._8_8_;
    pAStack_2a0 = (ArrayDisposer *)local_408._16_8_;
  }
  if (local_408[0] != false) {
    pFVar9 = (this->fields).ptr + ((ulong)pAStack_2a0 & 0xffffffff);
    if ((this->unionTagName).ptr.isSet == true) {
      local_220.tag = 2;
      local_220.field_1._0_4_ = 0xc;
      local_220.field_1._8_8_ = 0;
      local_348.ptr = (pFVar9->nameForDiscriminant).content.ptr;
      local_348.size_ = (pFVar9->nameForDiscriminant).content.size_;
      local_108.type = TEXT;
      prefix_02.content.size_ = local_438;
      prefix_02.content.ptr = (char *)local_440;
      local_108.field_1.intValue = (int64_t)local_348.ptr;
      local_108.field_1.textValue.super_StringPtr.content.size_ = local_348.size_;
      FlattenedField::FlattenedField
                ((FlattenedField *)local_408,prefix_02,
                 (StringPtr)(this->unionTagName).ptr.field_1.value.content,&local_220,&local_108);
      pFVar3 = (flattenedFields->builder).endPtr;
      if ((flattenedFields->builder).pos == pFVar3) {
        pFVar4 = (flattenedFields->builder).ptr;
        sVar10 = 4;
        if (pFVar3 != pFVar4) {
          sVar10 = ((long)pFVar3 - (long)pFVar4 >> 3) * -0x590b21642c8590b2;
        }
        kj::Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::setCapacity
                  (flattenedFields,sVar10);
      }
      kj::ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::
      add<capnp::JsonCodec::AnnotatedHandler::FlattenedField>
                (&flattenedFields->builder,(FlattenedField *)local_408);
      DynamicValue::Reader::~Reader(&local_398);
      uVar7 = local_408._8_8_;
      uVar6 = local_408._0_8_;
      if (local_408._40_4_ == 1) {
        local_408._40_4_ = 0;
      }
      if (local_408._40_4_ == 2) {
        local_408._40_4_ = 0;
      }
      if ((RawBrandedSchema *)local_408._0_8_ != (RawBrandedSchema *)0x0) {
        local_408._0_8_ = (RawBrandedSchema *)0x0;
        local_408._8_8_ = (Schema)0x0;
        (***(_func_int ***)local_408._16_8_)(local_408._16_8_,uVar6,1,uVar7,uVar7,0);
      }
      DynamicValue::Reader::~Reader(&local_108);
      if (local_220.tag == 1) {
        local_220.tag = 0;
      }
      if (local_220.tag == 2) {
        local_220.tag = 0;
      }
    }
    pAVar2 = (pFVar9->flattenHandler).ptr;
    if (pAVar2 == (AnnotatedHandler *)0x0) {
      TVar14 = StructSchema::Field::getType((Field *)(local_2b0 + 8));
      if ((((undefined1  [16])TVar14 & (undefined1  [16])0xffffff) != (undefined1  [16])0x0) ||
         (((this->unionTagName).ptr.isSet & 1U) == 0)) {
        AVar5 = (pFVar9->name).content;
        local_2f8.tag = 1;
        local_2f8.field_1._0_8_ = local_2b0._8_8_;
        local_2f8.field_1._8_8_ = pAStack_2a0;
        local_2f8.field_1._16_8_ = local_298;
        local_2f8.field_1._24_8_ = pCStack_290;
        local_2f8.field_1._32_4_ = (StructDataBitCount)local_288;
        local_2f8.field_1._36_2_ = local_288._4_2_;
        local_2f8.field_1.space[0x26] = local_288._6_1_;
        local_2f8.field_1.space[0x27] = local_288._7_1_;
        local_2f8.field_1._40_8_ = uStack_280;
        local_2f8.field_1._48_8_ = local_278;
        local_2f8.field_1._56_8_ = uStack_270;
        field_04._8_8_ = pAStack_2a0;
        field_04.parent.super_Schema.raw = (Schema)(Schema)local_2b0._8_8_;
        field_04.proto._reader.segment = local_298;
        field_04.proto._reader.capTable = pCStack_290;
        field_04.proto._reader.data = (void *)local_288;
        field_04.proto._reader.pointers = (WirePointer *)uStack_280;
        field_04.proto._reader._32_8_ = local_278;
        field_04.proto._reader._40_8_ = uStack_270;
        DynamicStruct::Reader::get(&local_150,&local_1d0,field_04);
        prefix_04.content.size_ = local_438;
        prefix_04.content.ptr = (char *)local_440;
        FlattenedField::FlattenedField
                  ((FlattenedField *)local_408,prefix_04,(StringPtr)AVar5,&local_2f8,&local_150);
        pFVar3 = (flattenedFields->builder).endPtr;
        if ((flattenedFields->builder).pos == pFVar3) {
          pFVar4 = (flattenedFields->builder).ptr;
          sVar10 = 4;
          if (pFVar3 != pFVar4) {
            sVar10 = ((long)pFVar3 - (long)pFVar4 >> 3) * -0x590b21642c8590b2;
          }
          kj::Vector<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::setCapacity
                    (flattenedFields,sVar10);
        }
        kj::ArrayBuilder<capnp::JsonCodec::AnnotatedHandler::FlattenedField>::
        add<capnp::JsonCodec::AnnotatedHandler::FlattenedField>
                  (&flattenedFields->builder,(FlattenedField *)local_408);
        DynamicValue::Reader::~Reader(&local_398);
        uVar7 = local_408._8_8_;
        uVar6 = local_408._0_8_;
        if (local_408._40_4_ == 1) {
          local_408._40_4_ = 0;
        }
        if (local_408._40_4_ == 2) {
          local_408._40_4_ = 0;
        }
        if ((RawBrandedSchema *)local_408._0_8_ != (RawBrandedSchema *)0x0) {
          local_408._0_8_ = (RawBrandedSchema *)0x0;
          local_408._8_8_ = (Schema)0x0;
          (***(_func_int ***)local_408._16_8_)(local_408._16_8_,uVar6,1,uVar7,uVar7,0);
        }
        DynamicValue::Reader::~Reader(&local_150);
        if (local_2f8.tag == 1) {
          local_2f8.tag = 0;
        }
        if (local_2f8.tag == 2) {
          local_2f8.tag = 0;
        }
      }
    }
    else {
      field_03._8_8_ = pAStack_2a0;
      field_03.parent.super_Schema.raw = (Schema)(Schema)local_2b0._8_8_;
      field_03.proto._reader.segment = local_298;
      field_03.proto._reader.capTable = pCStack_290;
      field_03.proto._reader.data = (void *)local_288;
      field_03.proto._reader.pointers = (WirePointer *)uStack_280;
      field_03.proto._reader._32_8_ = local_278;
      field_03.proto._reader._40_8_ = uStack_270;
      DynamicStruct::Reader::get(&local_198,&local_1d0,field_03);
      prefix_03.content.size_ = local_438;
      prefix_03.content.ptr = (char *)local_440;
      gatherForEncode(pAVar2,codec,&local_198,prefix_03,(StringPtr)(pFVar9->prefix).content,
                      flattenedFields);
      DynamicValue::Reader::~Reader(&local_198);
    }
  }
  if (local_428 != (RawBrandedSchema *)0x0) {
    (**local_418->_vptr_ArrayDisposer)(local_418,local_428,1,SStack_420.raw,SStack_420.raw,0);
  }
  return;
}

Assistant:

void gatherForEncode(const JsonCodec& codec, DynamicValue::Reader input,
                       kj::StringPtr prefix, kj::StringPtr morePrefix,
                       kj::Vector<FlattenedField>& flattenedFields) const {
    kj::String ownPrefix;
    if (morePrefix.size() > 0) {
      if (prefix.size() > 0) {
        ownPrefix = kj::str(prefix, morePrefix);
        prefix = ownPrefix;
      } else {
        prefix = morePrefix;
      }
    }

    auto reader = input.as<DynamicStruct>();
    auto schema = reader.getSchema();
    for (auto field: schema.getNonUnionFields()) {
      auto& info = fields[field.getIndex()];
      if (!reader.has(field, codec.impl->hasMode)) {
        // skip
      } else KJ_IF_SOME(handler, info.flattenHandler) {
        handler.gatherForEncode(codec, reader.get(field), prefix, info.prefix, flattenedFields);
      } else {
        flattenedFields.add(FlattenedField {
            prefix, info.name, field, reader.get(field) });
      }
    }